

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O1

shared_ptr<vmips::CFGNode> __thiscall
vmips::Function::branch_existing<vmips::j>(Function *this,shared_ptr<vmips::CFGNode> *node)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<vmips::CFGNode> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::CFGNode> sVar2;
  
  CFGNode::branch_existing<vmips::j>
            ((CFGNode *)
             node[0x14].super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,in_RDX);
  vmips::Function::switch_to((shared_ptr *)node);
  *(element_type **)this =
       (in_RDX->super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (in_RDX->super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar2.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::CFGNode>)
         sVar2.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CFGNode> branch_existing(const std::shared_ptr<CFGNode> &node, Args &&...args) {
            cursor->branch_existing<Instr>(node, std::forward<Args>(args)...);
            switch_to(node);
            return node;
        }